

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiSmokeTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_1::RefVertexShader::shadeVertices
          (RefVertexShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  VertexPacket *pVVar1;
  undefined8 local_38;
  undefined8 local_30;
  int local_28;
  int local_24;
  int packetNdx;
  int numPackets_local;
  VertexPacket **packets_local;
  VertexAttrib *inputs_local;
  RefVertexShader *this_local;
  
  local_24 = numPackets;
  _packetNdx = packets;
  packets_local = (VertexPacket **)inputs;
  inputs_local = (VertexAttrib *)this;
  for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
    rr::readVertexAttribFloat
              ((rr *)&local_38,(VertexAttrib *)packets_local,_packetNdx[local_28]->instanceNdx,
               _packetNdx[local_28]->vertexNdx);
    pVVar1 = _packetNdx[local_28];
    *(undefined8 *)(pVVar1->position).m_data = local_38;
    *(undefined8 *)((pVVar1->position).m_data + 2) = local_30;
  }
  return;
}

Assistant:

void shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		{
			packets[packetNdx]->position = rr::readVertexAttribFloat(inputs[0],
																	 packets[packetNdx]->instanceNdx,
																	 packets[packetNdx]->vertexNdx);
		}
	}